

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFromMappedGia(Gia_Man_t *p,int fFindEnables,int fUseBuffs)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint *puVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  Abc_Ntk_t *pAVar10;
  char *pcVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pAVar14;
  Abc_Ntk_t *pAVar15;
  Hop_Obj_t *pHVar16;
  Vec_Int_t *pVVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  Gia_Obj_t *pGVar25;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *paVar26;
  long lVar27;
  long lVar28;
  int iLitE;
  int iLitT;
  uint local_64;
  Abc_Ntk_t *local_60;
  uint local_58;
  int local_54;
  Abc_Obj_t *local_50;
  int local_44;
  Abc_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  if (((p->vMapping == (Vec_Int_t *)0x0) && (fFindEnables == 0)) && (p->pMuxes == (uint *)0x0)) {
    __assert_fail("Gia_ManHasMapping(p) || p->pMuxes || fFindEnables",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2ea,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  local_54 = fFindEnables;
  if ((fFindEnables != 0) && (p->pMuxes != (uint *)0x0)) {
    __assert_fail("!fFindEnables || !p->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2eb,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  pAVar10 = Abc_NtkAlloc(ABC_NTK_LOGIC,(uint)(p->vMapping != (Vec_Int_t *)0x0) * 2 + ABC_FUNC_SOP,1)
  ;
  pcVar11 = Extra_UtilStrsav(p->pName);
  pAVar10->pName = pcVar11;
  pcVar11 = Extra_UtilStrsav(p->pSpec);
  pAVar10->pSpec = pcVar11;
  Gia_ManFillValue(p);
  local_60 = pAVar10;
  local_40 = Abc_NtkCreateNodeConst0(pAVar10);
  p->pObjs->Value = local_40->Id;
  pVVar17 = p->vCis;
  uVar19 = (ulong)(uint)pVVar17->nSize;
  if (p->nRegs < pVVar17->nSize) {
    lVar23 = 0;
    do {
      if ((int)uVar19 <= lVar23) goto LAB_002a5bee;
      iVar8 = pVVar17->pArray[lVar23];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002a5bcf;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pAVar12 = Abc_NtkCreateObj(local_60,ABC_OBJ_PI);
      pGVar3[iVar8].Value = pAVar12->Id;
      lVar23 = lVar23 + 1;
      pVVar17 = p->vCis;
      uVar19 = (ulong)pVVar17->nSize;
    } while (lVar23 < (long)(uVar19 - (long)p->nRegs));
  }
  pVVar17 = p->vCos;
  uVar19 = (ulong)(uint)pVVar17->nSize;
  if (p->nRegs < pVVar17->nSize) {
    lVar23 = 0;
    do {
      if ((int)uVar19 <= lVar23) goto LAB_002a5bee;
      iVar8 = pVVar17->pArray[lVar23];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002a5bcf;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pAVar12 = Abc_NtkCreateObj(local_60,ABC_OBJ_PO);
      pGVar3[iVar8].Value = pAVar12->Id;
      lVar23 = lVar23 + 1;
      pVVar17 = p->vCos;
      uVar19 = (ulong)pVVar17->nSize;
    } while (lVar23 < (long)(uVar19 - (long)p->nRegs));
  }
  iVar8 = p->nRegs;
  local_44 = fUseBuffs;
  if (0 < iVar8) {
    iVar24 = 0;
    do {
      pAVar10 = local_60;
      iVar1 = p->vCos->nSize;
      uVar20 = (iVar1 - iVar8) + iVar24;
      if (((int)uVar20 < 0) || (iVar1 <= (int)uVar20)) goto LAB_002a5bee;
      iVar1 = p->vCos->pArray[uVar20];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_002a5bcf;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      iVar2 = p->vCis->nSize;
      uVar20 = (iVar2 - iVar8) + iVar24;
      if (((int)uVar20 < 0) || (iVar2 <= (int)uVar20)) goto LAB_002a5bee;
      iVar8 = p->vCis->pArray[uVar20];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002a5bcf;
      pAVar12 = Abc_NtkCreateObj(local_60,ABC_OBJ_LATCH);
      pAVar13 = Abc_NtkCreateObj(pAVar10,ABC_OBJ_BI);
      pAVar14 = Abc_NtkCreateObj(pAVar10,ABC_OBJ_BO);
      Abc_ObjAddFanin(pAVar12,pAVar13);
      Abc_ObjAddFanin(pAVar14,pAVar12);
      pGVar3[iVar1].Value = pAVar13->Id;
      pGVar3[iVar8].Value = pAVar14->Id;
      if ((*(uint *)&pAVar12->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
      }
      pAVar12->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      iVar24 = iVar24 + 1;
      iVar8 = p->nRegs;
    } while (iVar24 < iVar8);
  }
  pAVar10 = local_60;
  if (local_54 == 0) {
    iVar8 = p->nObjs;
    if (p->pMuxes == (uint *)0x0) {
      pAVar12 = (Abc_Obj_t *)malloc(0x10);
      iVar24 = 8;
      if (6 < iVar8 - 1U) {
        iVar24 = iVar8;
      }
      *(undefined4 *)((long)&pAVar12->pNtk + 4) = 0;
      *(int *)&pAVar12->pNtk = iVar24;
      if (iVar24 == 0) {
        pAVar13 = (Abc_Obj_t *)0x0;
      }
      else {
        pAVar13 = (Abc_Obj_t *)malloc((long)iVar24 << 3);
      }
      pAVar12->pNext = pAVar13;
      *(int *)((long)&pAVar12->pNtk + 4) = iVar8;
      memset(pAVar13,0,(long)iVar8 << 3);
      pAVar13 = local_40;
      pAVar10 = local_60;
      if (1 < p->nObjs) {
        lVar23 = 1;
        local_50 = pAVar12;
        do {
          iVar8 = p->vMapping->nSize;
          if (iVar8 <= lVar23) goto LAB_002a5bee;
          piVar7 = p->vMapping->pArray;
          uVar20 = piVar7[lVar23];
          if ((ulong)uVar20 != 0) {
            pGVar3 = p->pObjs;
            if (pGVar3[lVar23].Value != 0xffffffff) {
              __assert_fail("pObj->Value == ~0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                            ,0x353,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
            }
            if (((int)uVar20 < 0) || (iVar8 <= (int)uVar20)) goto LAB_002a5bee;
            pAVar14 = pAVar13;
            if (piVar7[uVar20] != 0) {
              pAVar14 = Abc_NtkCreateObj(pAVar10,ABC_OBJ_NODE);
              pVVar17 = p->vMapping;
              lVar28 = (long)pVVar17->nSize;
              if (lVar28 <= lVar23) goto LAB_002a5bee;
              lVar27 = 0;
              while( true ) {
                pAVar12 = local_50;
                piVar7 = pVVar17->pArray;
                lVar22 = (long)piVar7[lVar23];
                if ((lVar22 < 0) || ((int)lVar28 <= piVar7[lVar23])) goto LAB_002a5bee;
                if (piVar7[lVar22] <= lVar27) break;
                iVar8 = piVar7[lVar22 + lVar27 + 1];
                if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002a5bcf;
                uVar20 = p->pObjs[iVar8].Value;
                if (((long)(int)uVar20 < 0) || (pAVar10->vObjs->nSize <= (int)uVar20))
                goto LAB_002a5c0d;
                Abc_ObjAddFanin(pAVar14,(Abc_Obj_t *)pAVar10->vObjs->pArray[(int)uVar20]);
                lVar27 = lVar27 + 1;
                pVVar17 = p->vMapping;
                lVar28 = (long)pVVar17->nSize;
                if (lVar28 <= lVar23) goto LAB_002a5bee;
              }
              pHVar16 = Abc_ObjHopFromGia((Hop_Man_t *)pAVar10->pManFunc,p,(int)lVar23,
                                          (Vec_Ptr_t *)local_50);
              (pAVar14->field_5).pData = pHVar16;
            }
            pGVar3[lVar23].Value = pAVar14->Id;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < p->nObjs);
      }
      if (pAVar12->pNext != (Abc_Obj_t *)0x0) {
        free(pAVar12->pNext);
        pAVar12->pNext = (Abc_Obj_t *)0x0;
      }
      free(pAVar12);
    }
    else if (0 < iVar8) {
      lVar28 = 8;
      lVar23 = 0;
      do {
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar25 = (Gia_Obj_t *)((long)pGVar3 + lVar28 + -8);
        if ((~*(uint *)pGVar25 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar25) {
          pAVar12 = Abc_NtkCreateObj(pAVar10,ABC_OBJ_NODE);
          puVar5 = p->pMuxes;
          if ((puVar5 == (uint *)0x0) || (puVar5[lVar23] == 0)) {
            uVar19 = *(ulong *)pGVar25;
            iVar8 = (int)(uVar19 & 0x1fffffff);
            local_50 = pAVar12;
            if (((uVar19 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar19 < 0) ||
               (((uint)(uVar19 >> 0x20) & 0x1fffffff) <= ((uint)uVar19 & 0x1fffffff))) {
              iVar8 = *(int *)((long)pGVar3 + lVar28 + (ulong)(uint)(iVar8 << 2) * -3);
              if (((long)iVar8 < 0) || (pAVar10->vObjs->nSize <= iVar8)) goto LAB_002a5c0d;
              Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)pAVar10->vObjs->pArray[iVar8]);
              iVar8 = *(int *)((long)pGVar3 +
                              (ulong)((*(uint *)((long)pGVar3 + lVar28 + -4) & 0x1fffffff) << 2) *
                              -3 + lVar28);
              if (((long)iVar8 < 0) || (pAVar10->vObjs->nSize <= iVar8)) goto LAB_002a5c0d;
              Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)pAVar10->vObjs->pArray[iVar8]);
              pcVar11 = Abc_SopCreateAnd((Mem_Flex_t *)pAVar10->pManFunc,2,(int *)0x0);
            }
            else {
              iVar8 = *(int *)((long)pGVar3 + lVar28 + (ulong)(uint)(iVar8 << 2) * -3);
              if (((long)iVar8 < 0) || (pAVar10->vObjs->nSize <= iVar8)) goto LAB_002a5c0d;
              Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)pAVar10->vObjs->pArray[iVar8]);
              iVar8 = *(int *)((long)pGVar3 +
                              (ulong)((*(uint *)((long)pGVar3 + lVar28 + -4) & 0x1fffffff) << 2) *
                              -3 + lVar28);
              if (((long)iVar8 < 0) || (pAVar10->vObjs->nSize <= iVar8)) goto LAB_002a5c0d;
              Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)pAVar10->vObjs->pArray[iVar8]);
              pcVar11 = Abc_SopCreateXor((Mem_Flex_t *)pAVar10->pManFunc,2);
            }
            (pAVar12->field_5).pData = pcVar11;
            if ((*(byte *)((long)pGVar3 + lVar28 + -5) & 0x20) != 0) {
              Abc_SopComplementVar(pcVar11,0);
            }
            if (((undefined1  [12])*pGVar25 & (undefined1  [12])0x2000000000000000) !=
                (undefined1  [12])0x0) {
              paVar26 = &local_50->field_5;
              iVar8 = 1;
              goto LAB_002a583a;
            }
          }
          else {
            pGVar6 = p->pObjs;
            if ((pGVar25 < pGVar6) || (pGVar6 + p->nObjs <= pGVar25)) goto LAB_002a5c4b;
            if ((int)puVar5[(int)((ulong)((long)pGVar3 + (lVar28 - (long)pGVar6) + -8) >> 2) *
                            -0x55555555] < 0) goto LAB_002a5c6a;
            uVar20 = puVar5[(int)((ulong)((long)pGVar3 + (lVar28 - (long)pGVar6) + -8) >> 2) *
                            -0x55555555] >> 1;
            if (p->nObjs <= (int)uVar20) goto LAB_002a5bcf;
            uVar20 = pGVar6[uVar20].Value;
            if (((long)(int)uVar20 < 0) || (pAVar10->vObjs->nSize <= (int)uVar20))
            goto LAB_002a5c0d;
            local_38 = pGVar25;
            Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)pAVar10->vObjs->pArray[(int)uVar20]);
            iVar8 = *(int *)((long)pGVar3 +
                            (ulong)((*(uint *)((long)pGVar3 + lVar28 + -4) & 0x1fffffff) << 2) * -3
                            + lVar28);
            if (((long)iVar8 < 0) || (local_60->vObjs->nSize <= iVar8)) goto LAB_002a5c0d;
            Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)local_60->vObjs->pArray[iVar8]);
            pAVar10 = local_60;
            iVar8 = *(int *)((long)pGVar3 +
                            (ulong)((*(uint *)((long)pGVar3 + lVar28 + -8) & 0x1fffffff) << 2) * -3
                            + lVar28);
            if (((long)iVar8 < 0) || (local_60->vObjs->nSize <= iVar8)) goto LAB_002a5c0d;
            Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)local_60->vObjs->pArray[iVar8]);
            pcVar11 = Abc_SopCreateMux((Mem_Flex_t *)pAVar10->pManFunc);
            pGVar25 = local_38;
            (pAVar12->field_5).pData = pcVar11;
            if (p->pMuxes != (uint *)0x0) {
              pGVar6 = p->pObjs;
              if ((local_38 < pGVar6) || (pGVar6 + p->nObjs <= local_38)) goto LAB_002a5c4b;
              uVar20 = p->pMuxes[(int)((ulong)((long)pGVar3 + (lVar28 - (long)pGVar6) + -8) >> 2) *
                                 -0x55555555];
              if ((int)uVar20 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              if ((uVar20 & 1) != 0) {
                Abc_SopComplementVar(pcVar11,0);
              }
            }
            paVar26 = &pAVar12->field_5;
            if (((undefined1  [12])*pGVar25 & (undefined1  [12])0x2000000000000000) !=
                (undefined1  [12])0x0) {
              Abc_SopComplementVar((char *)paVar26->pData,1);
            }
            iVar8 = 2;
            if ((pGVar25->field_0x3 & 0x20) != 0) {
LAB_002a583a:
              Abc_SopComplementVar((char *)paVar26->pData,iVar8);
            }
          }
          *(int *)(&pGVar3->field_0x0 + lVar28) = pAVar12->Id;
        }
        lVar23 = lVar23 + 1;
        lVar28 = lVar28 + 0xc;
      } while (lVar23 < p->nObjs);
    }
  }
  else {
    pVVar17 = p->vCos;
    uVar19 = (ulong)(uint)pVVar17->nSize;
    if (0 < pVVar17->nSize) {
      lVar23 = 0;
      do {
        iVar8 = pVVar17->pArray[lVar23];
        if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002a5bcf;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar8;
        uVar4 = *(ulong *)pGVar3;
        if (((uVar4 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar4) ||
           ((int)((uint)(uVar4 >> 0x20) & 0x1fffffff) < (int)uVar19 - p->nRegs)) {
LAB_002a53a3:
          pAVar12 = (Abc_Obj_t *)0x0;
        }
        else {
          iVar8 = Gia_ObjIsMuxType(pGVar3 + -(uVar4 & 0x1fffffff));
          if (iVar8 == 0) {
            pAVar12 = (Abc_Obj_t *)0x0;
          }
          else {
            pGVar25 = p->pObjs;
            if ((pGVar3 < pGVar25) || (iVar8 = p->nObjs, pGVar25 + iVar8 <= pGVar3)) {
LAB_002a5c4b:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar20 = (int)((long)pGVar3 - (long)pGVar25 >> 2) * -0x55555555;
            if (((int)uVar20 < 0) || (iVar8 <= (int)uVar20)) goto LAB_002a5bcf;
            uVar9 = (uint)*(undefined8 *)(pGVar25 + (uVar20 & 0x7fffffff));
            if ((-1 < (int)uVar9) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
LAB_002a5ca8:
              __assert_fail("Gia_ObjIsRi(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar20 = (uint)((ulong)*(undefined8 *)(pGVar25 + (uVar20 & 0x7fffffff)) >> 0x20) &
                     0x1fffffff;
            iVar24 = p->vCos->nSize;
            if ((int)uVar20 < iVar24 - p->nRegs) goto LAB_002a5ca8;
            iVar1 = p->vCis->nSize;
            uVar20 = (iVar1 - iVar24) + uVar20;
            if (((int)uVar20 < 0) || (iVar1 <= (int)uVar20)) {
LAB_002a5bee:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar20 = p->vCis->pArray[uVar20];
            if (((int)uVar20 < 0) || (iVar8 <= (int)uVar20)) goto LAB_002a5bcf;
            uVar9 = Gia_ObjRecognizeMuxLits
                              (p,pGVar3 + -(ulong)((uint)*(ulong *)pGVar3 & 0x1fffffff),
                               (int *)&local_58,(int *)&local_64);
            if ((int)local_64 < 0) {
LAB_002a5c89:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            uVar21 = *(uint *)pGVar3 >> 0x1d & 1;
            uVar18 = local_64 ^ uVar21;
            local_64 = uVar18;
            if ((int)local_58 < 0) goto LAB_002a5c89;
            local_64 = uVar21 ^ local_58;
            uVar21 = local_58 >> 1;
            local_58 = local_64;
            if (uVar21 == uVar20) {
              local_58 = uVar18;
              if ((int)uVar9 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              uVar9 = uVar9 ^ 1;
              uVar18 = local_64;
            }
            local_64 = uVar18;
            if ((int)local_64 < 0) {
LAB_002a5c6a:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (local_64 >> 1 != uVar20) goto LAB_002a53a3;
            if ((((int)uVar9 < 0) ||
                (pAVar15 = (Abc_Ntk_t *)Abc_NtkFromMappedGia_rec(pAVar10,p,uVar9 >> 1,uVar9 & 1),
                (int)local_58 < 0)) ||
               (local_60 = pAVar15,
               pAVar13 = Abc_NtkFromMappedGia_rec(pAVar10,p,local_58 >> 1,local_58 & 1),
               (int)local_64 < 0)) goto LAB_002a5c6a;
            pAVar14 = Abc_NtkFromMappedGia_rec(pAVar10,p,local_64 >> 1,local_64 & 1);
            pAVar12 = Abc_NtkCreateObj(pAVar10,ABC_OBJ_NODE);
            Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)local_60);
            Abc_ObjAddFanin(pAVar12,pAVar13);
            Abc_ObjAddFanin(pAVar12,pAVar14);
            pcVar11 = Abc_SopCreateMux((Mem_Flex_t *)pAVar10->pManFunc);
            (pAVar12->field_5).pData = pcVar11;
          }
        }
        if (pAVar12 == (Abc_Obj_t *)0x0) {
          pGVar25 = p->pObjs;
          if ((pGVar3 < pGVar25) || (pGVar25 + p->nObjs <= pGVar3)) goto LAB_002a5c4b;
          pAVar12 = Abc_NtkFromMappedGia_rec
                              (pAVar10,p,
                               (int)((ulong)((long)pGVar3 - (long)pGVar25) >> 2) * -0x55555555 -
                               (*(uint *)pGVar3 & 0x1fffffff),*(uint *)pGVar3 >> 0x1d & 1);
        }
        if (pAVar10->vCos->nSize <= lVar23) goto LAB_002a5c0d;
        Abc_ObjAddFanin((Abc_Obj_t *)pAVar10->vCos->pArray[lVar23],pAVar12);
        lVar23 = lVar23 + 1;
        pVVar17 = p->vCos;
        uVar19 = (ulong)pVVar17->nSize;
      } while (lVar23 < (long)uVar19);
    }
  }
  iVar8 = local_44;
  if ((local_54 == 0) && (pVVar17 = p->vCos, 0 < pVVar17->nSize)) {
    lVar23 = 0;
    do {
      iVar24 = pVVar17->pArray[lVar23];
      if (((long)iVar24 < 0) || (p->nObjs <= iVar24)) {
LAB_002a5bcf:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar24;
      uVar9 = (uint)*(undefined8 *)pGVar3;
      uVar20 = pGVar3[-(ulong)(uVar9 & 0x1fffffff)].Value;
      if ((((long)(int)uVar20 < 0) || (pAVar10->vObjs->nSize <= (int)uVar20)) ||
         (pAVar10->vCos->nSize <= lVar23)) {
LAB_002a5c0d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pAVar10->vCos->pArray[lVar23],
                      (Abc_Obj_t *)
                      ((ulong)(uVar9 >> 0x1d & 1) ^ (ulong)pAVar10->vObjs->pArray[(int)uVar20]));
      lVar23 = lVar23 + 1;
      pVVar17 = p->vCos;
    } while (lVar23 < pVVar17->nSize);
  }
  Abc_NtkAddDummyPiNames(pAVar10);
  Abc_NtkAddDummyPoNames(pAVar10);
  Abc_NtkAddDummyBoxNames(pAVar10);
  Abc_NtkLogicMakeSimpleCos(pAVar10,(uint)(iVar8 == 0));
  if (((local_40->field_0x14 & 0xf) != 0) && ((local_40->vFanouts).nSize == 0)) {
    Abc_NtkDeleteObj(local_40);
  }
  iVar8 = p->nRegs;
  if (p->vCis->nSize - iVar8 != pAVar10->vPis->nSize) {
    __assert_fail("Gia_ManPiNum(p) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37c,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  if (p->vCos->nSize - iVar8 != pAVar10->vPos->nSize) {
    __assert_fail("Gia_ManPoNum(p) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37d,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  if (iVar8 != pAVar10->nObjCounts[8]) {
    __assert_fail("Gia_ManRegNum(p) == Abc_NtkLatchNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37e,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  pAVar15 = pAVar10;
  iVar8 = Abc_NtkCheck(pAVar10);
  if (iVar8 == 0) {
    Abc_Print((int)pAVar15,"Abc_NtkFromMappedGia(): Network check has failed.\n");
  }
  return pAVar10;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromMappedGia( Gia_Man_t * p, int fFindEnables, int fUseBuffs )
{
    int fVerbose = 0;
    int fDuplicate = 0;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjNewLi, * pObjNewLo, * pConst0 = NULL;
    Gia_Obj_t * pObj, * pObjLi, * pObjLo;
    Vec_Ptr_t * vReflect;
    int i, k, iFan, nDupGates, nCountMux = 0; 
    assert( Gia_ManHasMapping(p) || p->pMuxes || fFindEnables );
    assert( !fFindEnables || !p->pMuxes );
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, Gia_ManHasMapping(p) ? ABC_FUNC_AIG : ABC_FUNC_SOP, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(p->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(p->pSpec);
    Gia_ManFillValue( p );
    // create constant
    pConst0 = Abc_NtkCreateNodeConst0( pNtkNew );
    Gia_ManConst0(p)->Value = Abc_ObjId(pConst0);
    // create PIs
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Abc_ObjId( Abc_NtkCreatePi( pNtkNew ) );
    // create POs
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Abc_ObjId( Abc_NtkCreatePo( pNtkNew ) );
    // create as many latches as there are registers in the manager
    Gia_ManForEachRiRo( p, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjNewLi = Abc_NtkCreateBi( pNtkNew );
        pObjNewLo = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, pObjNewLi );
        Abc_ObjAddFanin( pObjNewLo, pObjNew );
        pObjLi->Value = Abc_ObjId( pObjNewLi );
        pObjLo->Value = Abc_ObjId( pObjNewLo );
        Abc_LatchSetInit0( pObjNew );
    }
    // rebuild the AIG
    if ( fFindEnables )
    {
        Gia_ManForEachCo( p, pObj, i )
        {
            pObjNew = NULL;
            if ( Gia_ObjIsRi(p, pObj) && Gia_ObjIsMuxType(Gia_ObjFanin0(pObj)) )
            {
                int iObjRo = Gia_ObjRiToRoId( p, Gia_ObjId(p, pObj) );
                int iLitE, iLitT, iCtrl = Gia_ObjRecognizeMuxLits( p, Gia_ObjFanin0(pObj), &iLitT, &iLitE );
                iLitE = Abc_LitNotCond( iLitE, Gia_ObjFaninC0(pObj) );
                iLitT = Abc_LitNotCond( iLitT, Gia_ObjFaninC0(pObj) );
                if ( Abc_Lit2Var(iLitT) == iObjRo )
                {
                    int iTemp = iLitE;
                    iLitE = iLitT;
                    iLitT = iTemp;
                    iCtrl = Abc_LitNot( iCtrl );
                }
                if ( Abc_Lit2Var(iLitE) == iObjRo )
                {
                    Abc_Obj_t * pObjCtrl  = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iCtrl), Abc_LitIsCompl(iCtrl) );
                    Abc_Obj_t * pObjNodeT = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iLitT), Abc_LitIsCompl(iLitT) );
                    Abc_Obj_t * pObjNodeE = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iLitE), Abc_LitIsCompl(iLitE) );
                    pObjNew = Abc_NtkCreateNode( pNtkNew );
                    Abc_ObjAddFanin( pObjNew, pObjCtrl );
                    Abc_ObjAddFanin( pObjNew, pObjNodeT );
                    Abc_ObjAddFanin( pObjNew, pObjNodeE );
                    pObjNew->pData = Abc_SopCreateMux( (Mem_Flex_t *)pNtkNew->pManFunc );
                    nCountMux++;
                }
            }
            if ( pObjNew == NULL )
                pObjNew = Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );
            Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
        }
    }
    else if ( p->pMuxes )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            pObjNew = Abc_NtkCreateNode( pNtkNew );
            if ( Gia_ObjIsMuxId(p, i) )
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin2(p, pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                pObjNew->pData = Abc_SopCreateMux( (Mem_Flex_t *)pNtkNew->pManFunc );
                if ( Gia_ObjFaninC2(p, pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )     Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
                if ( Gia_ObjFaninC0(pObj) )     Abc_SopComplementVar( (char *)pObjNew->pData, 2 );
            }
            else if ( Gia_ObjIsXor(pObj) )
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                pObjNew->pData = Abc_SopCreateXor( (Mem_Flex_t *)pNtkNew->pManFunc, 2 );
                if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
            }
            else 
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                pObjNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, 2, NULL );
                if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
            }
            pObj->Value = Abc_ObjId( pObjNew );
        }
    }
    else
    {
        vReflect = Vec_PtrStart( Gia_ManObjNum(p) );
        Gia_ManForEachLut( p, i )
        {
            pObj = Gia_ManObj(p, i);
            assert( pObj->Value == ~0 );
            if ( Gia_ObjLutSize(p, i) == 0 )
            {
                pObj->Value = Abc_ObjId(pConst0);
                continue;
            }
            pObjNew = Abc_NtkCreateNode( pNtkNew );
            Gia_LutForEachFanin( p, i, iFan, k )
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ManObj(p, iFan))) );
            pObjNew->pData = Abc_ObjHopFromGia( (Hop_Man_t *)pNtkNew->pManFunc, p, i, vReflect );
            pObj->Value = Abc_ObjId( pObjNew );
        }
        Vec_PtrFree( vReflect );
    }
    //if ( fFindEnables )
    //    printf( "Extracted %d flop enable signals.\n", nCountMux );
    // connect the PO nodes
    if ( !fFindEnables )
    Gia_ManForEachCo( p, pObj, i )
    {
        pObjNew = Abc_NtkObj( pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), Abc_ObjNotCond( pObjNew, Gia_ObjFaninC0(pObj) ) );
    }
    // create names
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    Abc_NtkAddDummyBoxNames( pNtkNew );

    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, !fUseBuffs );
    if ( fVerbose && nDupGates && !Abc_FrameReadFlag("silentmode") )
    {
        if ( !fDuplicate )
            printf( "Added %d buffers/inverters to decouple the CO drivers.\n", nDupGates );
        else
            printf( "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    }
    // remove const node if it is not used
    if ( !Abc_ObjIsNone(pConst0) && Abc_ObjFanoutNum(pConst0) == 0 )
        Abc_NtkDeleteObj( pConst0 );

    assert( Gia_ManPiNum(p) == Abc_NtkPiNum(pNtkNew) );
    assert( Gia_ManPoNum(p) == Abc_NtkPoNum(pNtkNew) );
    assert( Gia_ManRegNum(p) == Abc_NtkLatchNum(pNtkNew) );

    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromMappedGia(): Network check has failed.\n" );
    return pNtkNew;
}